

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_multiple_thread(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  element_type *this;
  int iVar3;
  pointer p_Var4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  __allocator_type __a2;
  long *local_f0;
  __shared_ptr<rest_rpc::rpc_client,_(__gnu_cxx::_Lock_policy)2> local_e8;
  shared_ptr<std::thread> local_d0;
  shared_ptr<rest_rpc::rpc_client> client;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::thread,_std::allocator<std::thread>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_b0;
  ulong local_a0;
  string str;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> v;
  vector<std::shared_ptr<rest_rpc::rpc_client>,_std::allocator<std::shared_ptr<rest_rpc::rpc_client>_>_>
  cls;
  
  cls.
  super__Vector_base<std::shared_ptr<rest_rpc::rpc_client>,_std::allocator<std::shared_ptr<rest_rpc::rpc_client>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cls.
  super__Vector_base<std::shared_ptr<rest_rpc::rpc_client>,_std::allocator<std::shared_ptr<rest_rpc::rpc_client>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cls.
  super__Vector_base<std::shared_ptr<rest_rpc::rpc_client>,_std::allocator<std::shared_ptr<rest_rpc::rpc_client>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v.super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v.super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v.super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = 0;
  do {
    if ((int)uVar6 == 4) {
      str._M_dataplus._M_p = (pointer)&str.field_2;
      str._M_string_length = 0;
      str.field_2._M_local_buf[0] = '\0';
      std::operator>>((istream *)&std::cin,(string *)&str);
      std::__cxx11::string::~string((string *)&str);
LAB_001472a8:
      std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::
      ~vector(&v);
      std::
      vector<std::shared_ptr<rest_rpc::rpc_client>,_std::allocator<std::shared_ptr<rest_rpc::rpc_client>_>_>
      ::~vector(&cls);
      return;
    }
    std::make_shared<rest_rpc::rpc_client>();
    std::
    vector<std::shared_ptr<rest_rpc::rpc_client>,_std::allocator<std::shared_ptr<rest_rpc::rpc_client>_>_>
    ::push_back(&cls,(value_type *)
                     &client.super___shared_ptr<rest_rpc::rpc_client,_(__gnu_cxx::_Lock_policy)2>);
    this = client.super___shared_ptr<rest_rpc::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string((string *)&str,"127.0.0.1",(allocator *)&local_b0);
    iVar3 = rest_rpc::rpc_client::connect(this,(int)&str,(sockaddr *)0x2328,0);
    std::__cxx11::string::~string((string *)&str);
    if ((char)iVar3 == '\0') {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&client.super___shared_ptr<rest_rpc::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      goto LAB_001472a8;
    }
    lVar5 = 2;
    local_a0 = uVar6;
    while (bVar7 = lVar5 != 0, lVar5 = lVar5 + -1, bVar7) {
      str._M_dataplus._M_p._0_4_ = 1;
      std::__cxx11::string::string((string *)&str._M_string_length,"tom",(allocator *)&local_b0);
      std::__shared_ptr<rest_rpc::rpc_client,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_e8,
                 &client.super___shared_ptr<rest_rpc::rpc_client,_(__gnu_cxx::_Lock_policy)2>);
      local_d0.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      p_Var4 = std::
               allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<std::thread,_std::allocator<std::thread>,_(__gnu_cxx::_Lock_policy)2>_>_>
               ::allocate(&__a2,1);
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_001734b8;
      (p_Var4->_M_impl)._M_storage._M_storage = (type)0x0;
      local_b0._M_alloc = &__a2;
      local_b0._M_ptr = p_Var4;
      local_f0 = (long *)operator_new(0x18);
      *local_f0 = (long)&PTR___State_impl_00173af8;
      uVar1 = local_e8._M_refcount._M_pi._0_4_;
      uVar2 = local_e8._M_refcount._M_pi._4_4_;
      local_e8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(undefined4 *)(local_f0 + 1) = local_e8._M_ptr._0_4_;
      *(undefined4 *)((long)local_f0 + 0xc) = local_e8._M_ptr._4_4_;
      *(undefined4 *)(local_f0 + 2) = uVar1;
      *(undefined4 *)((long)local_f0 + 0x14) = uVar2;
      local_e8._M_ptr = (element_type *)0x0;
      std::thread::_M_start_thread(&p_Var4->_M_impl,&local_f0,0);
      if (local_f0 != (long *)0x0) {
        (**(code **)(*local_f0 + 8))();
      }
      local_b0._M_ptr = (pointer)0x0;
      local_d0.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&p_Var4->_M_impl;
      local_d0.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           &p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::thread,_std::allocator<std::thread>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr(&local_b0);
      std::vector<std::shared_ptr<std::thread>,std::allocator<std::shared_ptr<std::thread>>>::
      emplace_back<std::shared_ptr<std::thread>>
                ((vector<std::shared_ptr<std::thread>,std::allocator<std::shared_ptr<std::thread>>>
                  *)&v,&local_d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_d0.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
      std::__cxx11::string::~string((string *)&str._M_string_length);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&client.super___shared_ptr<rest_rpc::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar6 = (ulong)((int)local_a0 + 1);
  } while( true );
}

Assistant:

void test_multiple_thread() {
  std::vector<std::shared_ptr<rpc_client>> cls;
  std::vector<std::shared_ptr<std::thread>> v;
  for (int j = 0; j < 4; ++j) {
    auto client = std::make_shared<rpc_client>();
    cls.push_back(client);
    bool r = client->connect("127.0.0.1", 9000);
    if (!r) {
      return;
    }

    for (size_t i = 0; i < 2; i++) {
      person p{1, "tom", 20};
      v.emplace_back(std::make_shared<std::thread>([client] {
        person p{1, "tom", 20};
        for (size_t i = 0; i < 1000000; i++) {
          client->async_call<0>(
              "get_name",
              [](const asio::error_code &ec, string_view data) {
                if (ec) {
                  std::cout << ec.message() << '\n';
                }
              },
              p);

          // auto future = client->async_call<FUTURE>("get_name", p);
          // auto status = future.wait_for(std::chrono::seconds(2));
          // if (status == std::future_status::deferred) {
          //	std::cout << "deferred\n";
          //}
          // else if (status == std::future_status::timeout) {
          //	std::cout << "timeout\n";
          //}
          // else if (status == std::future_status::ready) {
          //}

          // client->call<std::string>("get_name", p);
        }
      }));
    }
  }

  std::string str;
  std::cin >> str;
}